

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O2

int read_record(FILE *fp,int fields_number,char ***record_values)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char **ppcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  uint i;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  size_t sz;
  int iVar13;
  int local_4e60;
  char record [10000];
  char r_field [10000];
  
  if (fp != (FILE *)0x0 && -1 < fields_number) {
    memset(r_field,0,10000);
    uVar11 = (ulong)(uint)fields_number;
    ppcVar4 = (char **)malloc(uVar11 * 8);
    *record_values = ppcVar4;
    if (ppcVar4 == (char **)0x0) {
      return -1;
    }
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      pcVar5 = strdup("");
      (*record_values)[uVar8] = pcVar5;
    }
    pcVar5 = fgets(record,10000,(FILE *)fp);
    if (pcVar5 == (char *)0x0) {
      free_cstr_arr(*record_values,uVar11);
    }
    else {
      sVar6 = strlen(record);
      sVar7 = strlen(record);
      (record + sVar7)[0] = '\n';
      (record + sVar7)[1] = '\0';
      iVar13 = 0;
      uVar11 = 0;
      iVar12 = 0;
      bVar3 = false;
      while( true ) {
        while( true ) {
          while( true ) {
            bVar2 = bVar3;
            iVar9 = (int)uVar11;
            lVar10 = (long)iVar9;
            cVar1 = record[lVar10];
            uVar11 = lVar10 + 1;
            if (cVar1 != '\"') break;
            bVar3 = true;
            if (bVar2) {
              local_4e60 = (int)sVar6;
              bVar3 = false;
              if (((int)uVar11 < local_4e60) && (record[lVar10 + 1] == '\"')) {
                r_field[iVar12] = '\"';
                uVar11 = (ulong)(iVar9 + 2);
                iVar12 = iVar12 + 1;
                bVar3 = true;
              }
            }
          }
          if (cVar1 == '\0') {
            return 1;
          }
          if ((iVar13 < fields_number && !bVar2) && (cVar1 == '\n' || cVar1 == ',')) break;
          bVar3 = bVar2;
          if ((cVar1 != '\n') && (cVar1 != '\r')) {
            r_field[iVar12] = cVar1;
            iVar12 = iVar12 + 1;
          }
        }
        sz = (size_t)iVar13;
        free((*record_values)[sz]);
        pcVar5 = strdup(r_field);
        (*record_values)[sz] = pcVar5;
        if ((*record_values)[sz] == (char *)0x0) break;
        memset(r_field,0,10000);
        iVar13 = iVar13 + 1;
        iVar12 = 0;
        bVar3 = false;
      }
      free_cstr_arr(*record_values,sz);
    }
  }
  *record_values = (char **)0x0;
  return -1;
}

Assistant:

int read_record(FILE *fp, const int fields_number, char ***record_values) {
    char record[LINE_MAX_LEN];
    char r_field[LINE_MAX_LEN];
    int r_field_index = 0;
    int r_field_len = 0;
    int in_quotes = 0;  // to ignore commas in "dbl_quoted" field values

    if (fields_number < 0) {
        *record_values = NULL;
        return -1;
    }

    if (fp == NULL) {
        *record_values = NULL;
        return -1;
    }

    memset(r_field, 0, LINE_MAX_LEN);

    *record_values = malloc(fields_number * sizeof(char *));
    if (*record_values == NULL) {
        return -1;
    }
    for (unsigned i = 0; i < fields_number; i++)
        (*record_values)[i] = strdup("");

    if (!fgets(record, LINE_MAX_LEN, fp)) {
        free_cstr_arr(*record_values, fields_number);
        *record_values = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;
    int record_len = strlen(record);  // In theory, is guaranteed to have null-terminator, as
                                      // fgets() automatically applies one.
                                      // If not, pls PR or drop maintainer(s) a line.

    strcat(record, "\n");  // fixes the error that happens when the last record isn't followed by a newline
                           // (then the last record field fails to be parsed)

    while ((chr = record[++chr_pos - 1])) {
        if (chr == '"') {
            if (in_quotes == 0) {
                in_quotes = 1;
            } else {
                if (chr_pos < record_len && record[chr_pos] == '"') {
                    r_field[++r_field_len - 1] = '"';
                    chr_pos++;
                } else {
                    in_quotes = 0;
                }
            }
        } else if ((chr == ',' || chr == '\n') && !in_quotes && r_field_index < fields_number) {
            free((*record_values)[r_field_index]);
            (*record_values)[r_field_index] = strdup(r_field);

            if ((*record_values)[r_field_index] == NULL) {
                free_cstr_arr(*record_values, r_field_index);
                *record_values = NULL;
                return -1;
            }

            memset(r_field, 0, LINE_MAX_LEN);
            r_field_len = 0;
            r_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            r_field[++r_field_len - 1] = chr;
        }
    }
    return 1;
}